

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

int CheckOpponent(Situation *situation)

{
  uint uVar1;
  int iVar2;
  uint position;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *in_RDI;
  int from_id_1;
  int from_id;
  int i_2;
  int i_1;
  int horse_leg;
  int i;
  int to_col;
  int to_row;
  int from_col;
  int from_row;
  int to;
  int from;
  int player;
  int player_flag;
  int local_40;
  int local_3c;
  int local_34;
  int local_1c;
  uint local_4;
  
  uVar1 = GetPlayerFlag(*in_RDI);
  iVar7 = *in_RDI;
  iVar2 = OpponentPlayer(*in_RDI);
  iVar2 = GetPlayerFlag(iVar2);
  position = (uint)*(byte *)((long)in_RDI + (long)iVar2 + 0x104);
  iVar2 = GetRow(position);
  iVar3 = GetCol(position);
  local_34 = uVar1 + 5;
  while( true ) {
    if ((int)(uVar1 + 6) < local_34) {
      for (local_3c = uVar1 + 7; local_3c <= (int)(uVar1 + 8); local_3c = local_3c + 1) {
        uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_3c + 0x104);
        if (uVar4 != 0) {
          iVar5 = GetRow(uVar4);
          iVar6 = GetCol(uVar4);
          if (iVar6 == iVar3) {
            if ((*(ushort *)
                  ((long)(iVar5 + -3) * 0x2000 + 0x339d82 +
                  (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) &
                BIT_COL_MASK[(int)position]) != 0) {
              return local_3c;
            }
          }
          else if ((iVar5 == iVar2) &&
                  ((*(ushort *)
                     ((long)(iVar6 + -3) * 0x1000 + 0x330d82 +
                     (ulong)*(ushort *)((long)in_RDI + (long)iVar5 * 2 + 0x134) * 8) &
                   BIT_ROW_MASK[(int)position]) != 0)) {
            return local_3c;
          }
        }
      }
      for (local_40 = uVar1 + 9; local_40 <= (int)(uVar1 + 10); local_40 = local_40 + 1) {
        uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_40 + 0x104);
        if (uVar4 != 0) {
          iVar5 = GetRow(uVar4);
          iVar6 = GetCol(uVar4);
          if (iVar6 == iVar3) {
            if ((*(ushort *)
                  ((long)(iVar5 + -3) * 0x2000 + 0x339d84 +
                  (ulong)*(ushort *)((long)in_RDI + (long)iVar6 * 2 + 0x154) * 8) &
                BIT_COL_MASK[(int)position]) != 0) {
              return local_40;
            }
          }
          else if ((iVar5 == iVar2) &&
                  ((*(ushort *)
                     ((long)(iVar6 + -3) * 0x1000 + 0x330d84 +
                     (ulong)*(ushort *)((long)in_RDI + (long)iVar5 * 2 + 0x134) * 8) &
                   BIT_ROW_MASK[(int)position]) != 0)) {
            return local_40;
          }
        }
      }
      iVar7 = SquareBack(position,iVar7);
      local_4 = (uint)*(byte *)((long)in_RDI + (long)iVar7 + 4);
      if (((local_4 & uVar1) == 0) || ((local_4 & 0xf) < 0xb)) {
        for (local_1c = position - 1; local_1c <= (int)(position + 1); local_1c = local_1c + 2) {
          uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_1c + 4);
          if (((uVar4 & uVar1) != 0) && (10 < (uVar4 & 0xf))) {
            return uVar4;
          }
        }
        local_4 = 0;
      }
      return local_4;
    }
    uVar4 = (uint)*(byte *)((long)in_RDI + (long)local_34 + 0x104);
    if (((uVar4 != 0) && (HORSE_LEGAL_MOVE[(int)((position - uVar4) + 0x100)] + uVar4 != uVar4)) &&
       (*(char *)((long)in_RDI +
                 (long)(int)(HORSE_LEGAL_MOVE[(int)((position - uVar4) + 0x100)] + uVar4) + 4) ==
        '\0')) break;
    local_34 = local_34 + 1;
  }
  return local_34;
}

Assistant:

int CheckOpponent(const Situation & situation){
    // 1. 获得玩家特征值
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int from, to, from_row, from_col, to_row, to_col;

    // 1. 判断对方将(帅)是否在棋盘上，并记录其位置
    to = situation.current_pieces[GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0];
    // if(to == 0) return 1;
    to_row = GetRow(to);
    to_col = GetCol(to);

    // 2. 检测马的将军
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
            if(horse_leg != from && situation.current_board[horse_leg] == 0) return i;
        }
    }

    // 3. 检测车的将军
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }
    
    // 4. 检测炮的将军
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }

    // 5. 检测兵(卒)的将军(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
        return from_id;

    // 6. 检测兵(卒)的将军(横向)
    for(from = to - 1; from <= to + 1; from += 2){
        int from_id = situation.current_board[from];
        if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
            return from_id;
    }

    // 7. 没有被将军
    return 0;
}